

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

void prsdef(prscxdef *ctx,tokdef *tok,int typ)

{
  toksdef *ptVar1;
  char *pcVar2;
  toktdef *ptVar3;
  ushort uVar4;
  int iVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int typ_00;
  uint uVar6;
  
  if (tok->toktyp != 0x38) {
    return;
  }
  ptVar3 = (&ctx->prscxstab)[typ == 0xc];
  ptVar1 = &tok->toksym;
  typ_00 = typ;
  if ((tok->toksym).tokstyp == '\0') {
    if (ptVar3 == (toktdef *)0x0) goto LAB_0011d406;
    pcVar2 = tok->toknam;
    iVar5 = (*ptVar3->toktfsea)(ptVar3,pcVar2,tok->toklen,tok->tokhash,ptVar1);
    typ_00 = extraout_EDX;
    if (iVar5 == 0) {
      (*ptVar3->toktfadd)(ptVar3,pcVar2,tok->toklen,0,0,tok->tokhash);
      (*ptVar3->toktfsea)(ptVar3,pcVar2,tok->toklen,tok->tokhash,ptVar1);
      typ_00 = extraout_EDX_00;
    }
  }
  if (tok->toktyp != 0x38) {
    return;
  }
  if (ptVar1->tokstyp != '\0') {
    return;
  }
  if (ptVar3 == (toktdef *)0x0) {
LAB_0011d406:
    errsigf(ctx->prscxerr,"TADS",0x156);
  }
  switch(typ) {
  case 3:
    uVar6 = ctx->prscxprp;
    ctx->prscxprp = uVar6 + 1;
    (tok->toksym).toksval = (ushort)uVar6;
    break;
  case 7:
  case 8:
    prsdefobj(ctx,tok,typ_00);
    break;
  case 10:
    uVar4 = ctx->prscxextc;
    ctx->prscxextc = uVar4 + 1;
    goto LAB_0011d3e3;
  case 0xc:
    uVar6 = emtglbl(ctx->prscxemt);
    uVar4 = (ushort)uVar6;
LAB_0011d3e3:
    (tok->toksym).toksval = uVar4;
  }
  ptVar1->tokstyp = (uchar)typ;
  (*ptVar3->toktfset)(ptVar3,ptVar1);
  return;
}

Assistant:

void prsdef(prscxdef *ctx, tokdef *tok, int typ)
{
    toktdef *tab;
    
    tab = (typ == TOKSTLABEL ? ctx->prscxgtab : ctx->prscxstab);
    
    if (tok->toktyp == TOKTSYMBOL && tok->toksym.tokstyp == TOKSTUNK)
    {
        if (!tab) errsig(ctx->prscxerr, ERR_UNDFSYM);
                         
        /* see if it's been defined since we last looked */
        if (!(*tab->toktfsea)(tab, tok->toknam, tok->toklen,
                              tok->tokhash, &tok->toksym))
        {
            /* still not defined; add to the symbol table */
            (*tab->toktfadd)(tab, tok->toknam, tok->toklen,
                             TOKSTUNK, 0, tok->tokhash);
            (*tab->toktfsea)(tab, tok->toknam, tok->toklen,
                             tok->tokhash, &tok->toksym);
        }
    }
    if (tok->toktyp == TOKTSYMBOL && tok->toksym.tokstyp == TOKSTUNK)
    {
        if (!tab) errsig(ctx->prscxerr, ERR_UNDFSYM);

        switch(typ)
        {
        case TOKSTPROP:
            tok->toksym.toksval = ctx->prscxprp++;
            break;

        case TOKSTFWDOBJ:
        case TOKSTFWDFN:
            /* fill in the symbol with the object information */
            prsdefobj(ctx, tok, typ);
            break;

        case TOKSTEXTERN:
            tok->toksym.toksval = ctx->prscxextc++;
            break;
            
        case TOKSTLABEL:
            tok->toksym.toksval = emtglbl(ctx->prscxemt);
            break;
        }
        tok->toksym.tokstyp = typ;
        (*tab->toktfset)(tab, &tok->toksym);
    }
}